

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::LogDestination::SetLogFilenameExtension(char *ext)

{
  Mutex *this;
  string *__lhs;
  FILE *__stream;
  bool bVar1;
  LogDestination *pLVar2;
  int severity;
  
  ::glog_internal_namespace_::Mutex::Lock((Mutex *)log_mutex);
  for (severity = 0; severity != 4; severity = severity + 1) {
    pLVar2 = log_destination(severity);
    this = &(pLVar2->fileobject_).lock_;
    ::glog_internal_namespace_::Mutex::Lock(this);
    __lhs = &(pLVar2->fileobject_).filename_extension_;
    bVar1 = std::operator!=(__lhs,ext);
    if (bVar1) {
      __stream = (FILE *)(pLVar2->fileobject_).file_;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
        (pLVar2->fileobject_).file_ = (FILE *)0x0;
        (pLVar2->fileobject_).rollover_attempt_ = 0x1f;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__lhs,ext);
    }
    ::glog_internal_namespace_::Mutex::Unlock(this);
  }
  ::glog_internal_namespace_::Mutex::Unlock((Mutex *)log_mutex);
  return;
}

Assistant:

inline void LogDestination::SetLogFilenameExtension(const char* ext) {
  // Prevent any subtle race conditions by wrapping a mutex lock around
  // all this stuff.
  MutexLock l(&log_mutex);
  for ( int severity = 0; severity < NUM_SEVERITIES; ++severity ) {
    log_destination(severity)->fileobject_.SetExtension(ext);
  }
}